

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O2

nvlist_t * nvlist_clone(nvlist_t *nvl)

{
  int iVar1;
  int *piVar2;
  nvlist_t *nvl_00;
  nvpair_t *nvp;
  nvpair_t *nvp_00;
  char *__assertion;
  
  if (nvl == (nvlist_t *)0x0) {
    __assertion = "(nvl) != ((void*)0)";
  }
  else {
    if (nvl->nvl_magic == 0x6e766c) {
      iVar1 = nvl->nvl_error;
      if (iVar1 == 0) {
        nvl_00 = nvlist_create(nvl->nvl_flags & 3);
        for (nvp = nvlist_first_nvpair(nvl); nvp != (nvpair_t *)0x0;
            nvp = nvlist_next_nvpair(nvl,nvp)) {
          nvp_00 = nvpair_clone(nvp);
          if (nvp_00 == (nvpair_t *)0x0) {
            nvlist_destroy(nvl_00);
            goto LAB_001073fb;
          }
          nvlist_move_nvpair(nvl_00,nvp_00);
        }
      }
      else {
        piVar2 = __errno_location();
        *piVar2 = iVar1;
LAB_001073fb:
        nvl_00 = (nvlist_t *)0x0;
      }
      return nvl_00;
    }
    __assertion = "(nvl)->nvl_magic == 0x6e766c";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0x17f,"nvlist_t *nvlist_clone(const nvlist_t *)");
}

Assistant:

nvlist_t *
nvlist_clone(const nvlist_t *nvl)
{
	nvlist_t *newnvl;
	nvpair_t *nvp, *newnvp;

	NVLIST_ASSERT(nvl);

	if (nvl->nvl_error != 0) {
		ERRNO_SET(nvl->nvl_error);
		return (NULL);
	}

	newnvl = nvlist_create(nvl->nvl_flags & NV_FLAG_PUBLIC_MASK);
	for (nvp = nvlist_first_nvpair(nvl); nvp != NULL;
	    nvp = nvlist_next_nvpair(nvl, nvp)) {
		newnvp = nvpair_clone(nvp);
		if (newnvp == NULL)
			break;
		(void)nvlist_move_nvpair(newnvl, newnvp);
	}
	if (nvp != NULL) {
		nvlist_destroy(newnvl);
		return (NULL);
	}
	return (newnvl);
}